

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.hpp
# Opt level: O2

CmdLine * __thiscall
Args::details::
API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
::addArgWithFlagAndName<char_const(&)[3]>
          (API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
           *this,Char flag,char (*name) [3],bool isWithValue,bool isRequired,String *desc,
          String *longDesc,String *defaultValue,String *valueSpecifier)

{
  API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
  *pAVar1;
  Arg *this_00;
  ArgPtr local_48;
  API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
  *local_38;
  
  local_38 = this;
  this_00 = (Arg *)operator_new(0xf8);
  Arg::Arg<char_const(&)[3]>(this_00,flag,name,isWithValue,isRequired);
  if (desc->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this_00->m_description);
  }
  if (longDesc->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this_00->m_longDescription);
  }
  if (defaultValue->_M_string_length != 0) {
    (*(this_00->super_ArgIface)._vptr_ArgIface[0x16])(this_00);
  }
  if (valueSpecifier->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this_00->m_valueSpecifier);
  }
  pAVar1 = local_38;
  local_48._M_t.super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
  super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
  super__Tuple_impl<1UL,_Args::details::Deleter<Args::ArgIface>_>.
  super__Head_base<1UL,_Args::details::Deleter<Args::ArgIface>,_false>._M_head_impl.m_delete =
       (_Head_base<1UL,_Args::details::Deleter<Args::ArgIface>,_false>)(Deleter<Args::ArgIface>)0x1;
  local_48._M_t.super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
  super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
  super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl = (ArgIface *)this_00;
  CmdLine::addArg(*(CmdLine **)(local_38 + 0x10),&local_48);
  if (((Arg *)local_48._M_t.
              super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
              super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
              super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl != (Arg *)0x0) &&
     (local_48._M_t.super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>.
      _M_t.super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
      super__Tuple_impl<1UL,_Args::details::Deleter<Args::ArgIface>_>.
      super__Head_base<1UL,_Args::details::Deleter<Args::ArgIface>,_false>._M_head_impl.m_delete ==
      (Deleter<Args::ArgIface>)0x1)) {
    (*((ArgIface *)
      &(local_48._M_t.super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>
        ._M_t.super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
        super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl)->_vptr_ArgIface)->
      _vptr_ArgIface[1])();
  }
  return *(CmdLine **)(pAVar1 + 8);
}

Assistant:

PARENT & addArgWithFlagAndName(
		//! Flag for this argument.
		Char flag,
		//! Name for this argument.
		NAME && name,
		//! Is this argument with value?
		bool isWithValue = false,
		//! Is this argument required?
		bool isRequired = false,
		//! Description of the argument.
		const String & desc = String(),
		//! Long description.
		const String & longDesc = String(),
		//! Default value.
		const String & defaultValue = String(),
		//! Value specifier.
		const String & valueSpecifier = String() )
	{

		auto arg = std::unique_ptr< Arg, details::Deleter< ArgIface > > (
			new Arg( flag, std::forward< NAME > ( name ), isWithValue,
				isRequired ),
			details::Deleter< ArgIface > ( true ) );

		if( !desc.empty() )
			arg->setDescription( desc );

		if( !longDesc.empty() )
			arg->setLongDescription( longDesc );

		if( !defaultValue.empty() )
			arg->setDefaultValue( defaultValue );

		if( !valueSpecifier.empty() )
			arg->setValueSpecifier( valueSpecifier );

		ARGPTR a = std::move( arg );

		m_self.addArg( std::move( a ) );

		return m_parent;
	}